

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

undefined8 GetDatetimeWithoutSpecialChars_abi_cxx11_(void)

{
  undefined8 in_RDI;
  char local_52 [2];
  char *local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_2a [2];
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined1 local_11;
  string *datetime;
  
  local_11 = 0;
  GetDatetime_abi_cxx11_();
  local_20._M_current = (char *)std::__cxx11::string::begin();
  local_28 = (char *)std::__cxx11::string::end();
  local_2a[1] = 0x20;
  local_2a[0] = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_20,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_28,local_2a + 1,local_2a);
  local_48._M_current = (char *)std::__cxx11::string::begin();
  local_50 = (char *)std::__cxx11::string::end();
  local_52[1] = 0x3a;
  local_52[0] = '.';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_48,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_50,local_52 + 1,local_52);
  return in_RDI;
}

Assistant:

string GetDatetimeWithoutSpecialChars()
{
    string datetime(GetDatetime());
    std::replace(datetime.begin(), datetime.end(), ' ', '_');
    std::replace(datetime.begin(), datetime.end(), ':', '.');
    return datetime;
}